

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

void anon_unknown.dwarf_1c2549::allocatePixels
               (int type,Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *uintData,
               Array2D<float_*> *floatData,Array2D<half_*> *halfData,int x1,int x2,int y1,int y2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  sbyte sVar7;
  long lVar8;
  half ***ppphVar9;
  long lVar10;
  int iVar11;
  long local_88;
  long local_78;
  
  if (y1 <= y2) {
    lVar5 = (long)y1;
    local_88 = lVar5 * 4;
    local_78 = lVar5 * 8;
    do {
      if (x1 <= x2) {
        lVar1 = halfData->_sizeY;
        lVar2 = floatData->_sizeY;
        lVar3 = uintData->_sizeY;
        lVar4 = sampleCount->_sizeY;
        lVar10 = (long)x1;
        iVar11 = (x2 - x1) + 1;
        do {
          sVar7 = 2;
          lVar8 = lVar3;
          ppphVar9 = (half ***)&uintData->_data;
          if (type == 0) {
LAB_0016fe8d:
            pvVar6 = operator_new__((ulong)*(uint *)((long)sampleCount->_data +
                                                    lVar10 * 4 + lVar4 * local_88) << sVar7);
            *(void **)((long)*ppphVar9 + lVar10 * 8 + lVar8 * local_78) = pvVar6;
          }
          else {
            if (type == 2) {
              sVar7 = 1;
              lVar8 = lVar1;
              ppphVar9 = &halfData->_data;
              goto LAB_0016fe8d;
            }
            lVar8 = lVar2;
            ppphVar9 = (half ***)&floatData->_data;
            if (type == 1) goto LAB_0016fe8d;
          }
          lVar10 = lVar10 + 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      lVar5 = lVar5 + 1;
      local_88 = local_88 + 4;
      local_78 = local_78 + 8;
    } while (y2 + 1 != (int)lVar5);
  }
  return;
}

Assistant:

void
allocatePixels (int type,
                Array2D<unsigned int>& sampleCount,
                Array2D<unsigned int*>& uintData,
                Array2D<float*>& floatData,
                Array2D<half*>& halfData,
                int x1, int x2, int y1, int y2)
{
    for (int y = y1; y <= y2; y++)
    {
        for (int x = x1; x <= x2; x++)
        {
            if (type == 0)
                uintData[y][x] = new unsigned int[sampleCount[y][x]];
            if (type == 1)
                floatData[y][x] = new float[sampleCount[y][x]];
            if (type == 2)
                halfData[y][x] = new half[sampleCount[y][x]];
        }
    }
}